

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_save.c
# Opt level: O2

void do_asave(CHAR_DATA *ch,char *argument)

{
  DESCRIPTOR_DATA *pDVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  AREA_DATA_conflict *pAVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  AREA_DATA_conflict **ppAVar9;
  string_view fmt;
  char arg1 [4608];
  char buf [4608];
  
  bVar2 = check_security(ch);
  if (!bVar2) {
    return;
  }
  if (ch == (CHAR_DATA *)0x0) {
    save_area_list();
    ppAVar9 = &area_first;
    while (ppAVar9 = &((AREA_DATA_conflict *)ppAVar9)->next->next,
          (AREA_DATA_conflict *)ppAVar9 != (AREA_DATA_conflict *)0x0) {
      *(byte *)((AREA_DATA_conflict *)ppAVar9)->area_flags =
           (byte)((AREA_DATA_conflict *)ppAVar9)->area_flags[0] & 199;
      save_area((AREA_DATA_conflict *)ppAVar9);
    }
    return;
  }
  iVar4 = get_security(ch);
  if (9 < iVar4) {
    smash_tilde(argument);
    strcpy(arg1,argument);
    if (arg1[0] == '\0') {
      send_to_char("Syntax:\n\r",ch);
      send_to_char("  asave <vnum>   - saves a particular area\n\r",ch);
      send_to_char("  asave list     - saves the area.lst file\n\r",ch);
      send_to_char("  asave area     - saves the area being edited\n\r",ch);
      send_to_char("  asave changed  - saves all changed zones\n\r",ch);
      send_to_char("  asave world    - saves the world! (db dump)\n\r",ch);
      pcVar8 = "\n\r";
      goto LAB_003a82df;
    }
    iVar4 = atoi(arg1);
    pAVar5 = get_area_data(iVar4);
    if ((pAVar5 == (AREA_DATA_conflict *)0x0) && (bVar2 = is_number(arg1), bVar2)) {
      pcVar8 = "That area does not exist.\n\r";
      goto LAB_003a82df;
    }
    bVar2 = is_number(arg1);
    if (bVar2) {
      bVar2 = is_switched(ch);
      if (!bVar2) {
        if (pAVar5->security < ch->pcdata->security) {
LAB_003a81df:
          save_area_list();
          *(byte *)pAVar5->area_flags = (byte)pAVar5->area_flags[0] & 199;
          save_area(pAVar5);
          return;
        }
        pcVar8 = pAVar5->builders;
        pcVar6 = strstr(pcVar8,ch->name);
        if ((pcVar6 != (char *)0x0) || (pcVar8 = strstr(pcVar8,"All"), pcVar8 != (char *)0x0))
        goto LAB_003a81df;
      }
    }
    else {
      bVar2 = str_cmp("world",arg1);
      if (!bVar2) {
        save_area_list();
        ppAVar9 = &area_first;
LAB_003a821a:
        do {
          ppAVar9 = &((AREA_DATA_conflict *)ppAVar9)->next->next;
          if ((AREA_DATA_conflict *)ppAVar9 == (AREA_DATA_conflict *)0x0) goto LAB_003a82d8;
          bVar2 = is_switched(ch);
          if (!bVar2) {
            if (ch->pcdata->security <= ((AREA_DATA_conflict *)ppAVar9)->security) {
              pcVar8 = ((AREA_DATA_conflict *)ppAVar9)->builders;
              pcVar6 = strstr(pcVar8,ch->name);
              if ((pcVar6 == (char *)0x0) && (pcVar8 = strstr(pcVar8,"All"), pcVar8 == (char *)0x0))
              goto LAB_003a821a;
            }
            if ((((AREA_DATA_conflict *)ppAVar9)->area_flags[0] & 0x18U) != 0) {
              ((AREA_DATA_conflict *)ppAVar9)->area_flags[0] =
                   ((AREA_DATA_conflict *)ppAVar9)->area_flags[0] & 0xffffffffffffffc7;
              pcVar8 = ((AREA_DATA_conflict *)ppAVar9)->name;
              sVar7 = strlen(pcVar8);
              fmt._M_str = pcVar8;
              fmt._M_len = sVar7;
              CLogger::Info<>((CLogger *)&RS.field_0x140,fmt);
              sprintf(buf,"Saving..%s\n",((AREA_DATA_conflict *)ppAVar9)->name);
              wiznet(buf,(CHAR_DATA *)0x0,(OBJ_DATA *)0x0,0x18,0,0);
              save_area((AREA_DATA_conflict *)ppAVar9);
            }
          }
        } while( true );
      }
      bVar2 = str_cmp("changed",arg1);
      if (!bVar2) {
        save_area_list();
        send_to_char("Saved zones:\n\r",ch);
        builtin_strncpy(buf,"None.\n\r",8);
        ppAVar9 = &area_first;
LAB_003a8337:
        do {
          ppAVar9 = &((AREA_DATA_conflict *)ppAVar9)->next->next;
          if ((AREA_DATA_conflict *)ppAVar9 == (AREA_DATA_conflict *)0x0) goto LAB_003a83cd;
          bVar2 = is_switched(ch);
          if (!bVar2) {
            if (ch->pcdata->security <= ((AREA_DATA_conflict *)ppAVar9)->security) {
              pcVar8 = ((AREA_DATA_conflict *)ppAVar9)->builders;
              pcVar6 = strstr(pcVar8,ch->name);
              if ((pcVar6 == (char *)0x0) && (pcVar8 = strstr(pcVar8,"All"), pcVar8 == (char *)0x0))
              goto LAB_003a8337;
            }
            if ((((AREA_DATA_conflict *)ppAVar9)->area_flags[0] & 0x18U) != 0) {
              ((AREA_DATA_conflict *)ppAVar9)->area_flags[0] =
                   ((AREA_DATA_conflict *)ppAVar9)->area_flags[0] & 0xffffffffffffffc7;
              save_area((AREA_DATA_conflict *)ppAVar9);
              sprintf(buf,"%24s - \'%s\'\n\r",((AREA_DATA_conflict *)ppAVar9)->name,
                      ((AREA_DATA_conflict *)ppAVar9)->file_name);
              send_to_char(buf,ch);
            }
          }
        } while( true );
      }
      bVar2 = str_cmp(arg1,"list");
      if (!bVar2) {
        save_area_list();
        return;
      }
      bVar2 = str_cmp(arg1,"area");
      if (bVar2) {
        do_asave(ch,"");
        return;
      }
      pDVar1 = ch->desc;
      switch(pDVar1->editor) {
      case 0:
        pcVar8 = "You are not editing an area therefore an area vnum is required.\n\r";
        goto LAB_003a82df;
      case 1:
        ppAVar9 = (AREA_DATA_conflict **)&pDVar1->pEdit;
        break;
      default:
        ppAVar9 = &ch->in_room->area;
        break;
      case 3:
      case 4:
        ppAVar9 = (AREA_DATA_conflict **)((long)pDVar1->pEdit + 0x28);
      }
      pAVar5 = *ppAVar9;
      bVar2 = is_switched(ch);
      if (!bVar2) {
        if (ch->pcdata->security <= pAVar5->security) {
          pcVar8 = pAVar5->builders;
          pcVar6 = strstr(pcVar8,ch->name);
          if ((pcVar6 == (char *)0x0) && (pcVar8 = strstr(pcVar8,"All"), pcVar8 == (char *)0x0))
          goto LAB_003a7f5f;
        }
        save_area_list();
        *(byte *)pAVar5->area_flags = (byte)pAVar5->area_flags[0] & 199;
        save_area(pAVar5);
        pcVar8 = "Area saved.\n\r";
        goto LAB_003a82df;
      }
    }
LAB_003a7f5f:
    pcVar8 = "You are not a builder for this area.\n\r";
    goto LAB_003a82df;
  }
  one_argument(argument,arg1);
  if (arg1[0] != '\0') {
    bVar2 = str_cmp(arg1,"changed");
    if (!bVar2) {
      ppAVar9 = &area_first;
      bVar2 = false;
LAB_003a8006:
      do {
        ppAVar9 = &((AREA_DATA_conflict *)ppAVar9)->next->next;
        if ((AREA_DATA_conflict *)ppAVar9 == (AREA_DATA_conflict *)0x0) goto LAB_003a80a3;
        bVar3 = is_switched(ch);
        if (!bVar3) {
          if (ch->pcdata->security <= ((AREA_DATA_conflict *)ppAVar9)->security) {
            pcVar8 = ((AREA_DATA_conflict *)ppAVar9)->builders;
            pcVar6 = strstr(pcVar8,ch->name);
            if ((pcVar6 == (char *)0x0) && (pcVar8 = strstr(pcVar8,"All"), pcVar8 == (char *)0x0))
            goto LAB_003a8006;
          }
          if ((((AREA_DATA_conflict *)ppAVar9)->area_flags[0] & 0x18U) != 0) {
            ((AREA_DATA_conflict *)ppAVar9)->area_flags[0] =
                 ((AREA_DATA_conflict *)ppAVar9)->area_flags[0] & 0xffffffffffffffc7;
            save_area((AREA_DATA_conflict *)ppAVar9);
            sprintf(buf,"%24s - \'%s\'\n\r",((AREA_DATA_conflict *)ppAVar9)->name,
                    ((AREA_DATA_conflict *)ppAVar9)->file_name);
            send_to_char(buf,ch);
            bVar2 = true;
          }
        }
      } while( true );
    }
    send_to_char("Syntax:\n\r",ch);
    send_to_char("  asave         - saves area you are currently in.\n\r",ch);
    pcVar8 = "  asave changed - saves all areas in your name that have been changed.\n\r";
    goto LAB_003a82df;
  }
  bVar2 = is_switched(ch);
  if (bVar2) {
LAB_003a7f7b:
    pcVar8 = "You are not in your area.\n\r";
  }
  else {
    pAVar5 = ch->in_room->area;
    if (ch->pcdata->security <= pAVar5->security) {
      pcVar8 = pAVar5->builders;
      pcVar6 = strstr(pcVar8,ch->name);
      if ((pcVar6 == (char *)0x0) && (pcVar8 = strstr(pcVar8,"All"), pcVar8 == (char *)0x0))
      goto LAB_003a7f7b;
    }
    *(byte *)pAVar5->area_flags = (byte)pAVar5->area_flags[0] & 199;
    save_area(pAVar5);
    pcVar8 = "Saved.\n\r";
  }
LAB_003a82df:
  send_to_char(pcVar8,ch);
  return;
LAB_003a82d8:
  pcVar8 = "You saved the world.\n\r";
  goto LAB_003a82df;
LAB_003a83cd:
  bVar2 = str_cmp(buf,"None.\n\r");
  if (bVar2) {
    return;
  }
  pcVar8 = buf;
  goto LAB_003a82df;
LAB_003a80a3:
  if (bVar2) {
    return;
  }
  pcVar8 = "No areas were saved.\n\r";
  goto LAB_003a82df;
}

Assistant:

void do_asave(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH], buf[MSL];
	AREA_DATA *pArea;
	FILE *fp;
	int value;
	bool found = false;

	fp = nullptr;

	if (!check_security(ch))
		return;

	if (!ch) /* Do an autosave */
	{
		save_area_list();

		for (pArea = area_first; pArea; pArea = pArea->next)
		{
			clean_olc_aflags(pArea);
			save_area(pArea);
		}

		return;
	}

	if (get_security(ch) < 10)
	{
		argument = one_argument(argument, arg1);

		if (arg1[0] == '\0')
		{
			if (IS_BUILDER(ch, ch->in_room->area))
			{
				clean_olc_aflags(ch->in_room->area);
				save_area(ch->in_room->area);
				send_to_char("Saved.\n\r", ch);
				return;
			}
			else
			{
				send_to_char("You are not in your area.\n\r", ch);
				return;
			}
		}
		else if (!str_cmp(arg1, "changed"))
		{
			for (pArea = area_first; pArea; pArea = pArea->next)
			{
				if (!IS_BUILDER(ch, pArea))
					continue;

				if (IS_SET(pArea->area_flags, AREA_CHANGED) || IS_SET(pArea->area_flags, AREA_ADDED))
				{
					found = true;
					clean_olc_aflags(pArea);
					save_area(pArea);
					sprintf(buf, "%24s - '%s'\n\r", pArea->name, pArea->file_name);
					send_to_char(buf, ch);
				}
			}

			if (!found)
				send_to_char("No areas were saved.\n\r", ch);
		}
		else
		{
			send_to_char("Syntax:\n\r", ch);
			send_to_char("  asave         - saves area you are currently in.\n\r", ch);
			send_to_char("  asave changed - saves all areas in your name that have been changed.\n\r", ch);
			return;
		}
	}
	else
	{
		smash_tilde(argument);
		strcpy(arg1, argument);

		if (arg1[0] == '\0')
		{
			send_to_char("Syntax:\n\r", ch);
			send_to_char("  asave <vnum>   - saves a particular area\n\r", ch);
			send_to_char("  asave list     - saves the area.lst file\n\r", ch);
			send_to_char("  asave area     - saves the area being edited\n\r", ch);
			send_to_char("  asave changed  - saves all changed zones\n\r", ch);
			send_to_char("  asave world    - saves the world! (db dump)\n\r", ch);
			send_to_char("\n\r", ch);
			return;
		}

		/* Snarf the value (which need not be numeric). */
		value = atoi(arg1);

		if (!(pArea = get_area_data(value)) && is_number(arg1))
		{
			send_to_char("That area does not exist.\n\r", ch);
			return;
		}

		/* Save area of given vnum. */
		/* ------------------------ */
		if (is_number(arg1))
		{
			if (!IS_BUILDER(ch, pArea))
			{
				send_to_char("You are not a builder for this area.\n\r", ch);
				return;
			}

			save_area_list();
			clean_olc_aflags(pArea);
			save_area(pArea);
			return;
		}

		/* Save the world, only authorized areas. */
		/* -------------------------------------- */
		if (!str_cmp("world", arg1))
		{
			save_area_list();

			for (pArea = area_first; pArea != nullptr; pArea = pArea->next)
			{
				char buf[MSL];

				if (!IS_BUILDER(ch, pArea))
					continue;

				if (!IS_SET(pArea->area_flags, AREA_CHANGED) && !IS_SET(pArea->area_flags, AREA_ADDED))
					continue;

				clean_olc_aflags(pArea);
				RS.Logger.Info(pArea->name);

				sprintf(buf, "Saving..%s\n", pArea->name);
				wiznet(buf, 0, nullptr, WIZ_DEBUG, 0, 0);

				save_area(pArea);
			}

			send_to_char("You saved the world.\n\r", ch);
			return;
		}

		/* Save changed areas, only authorized areas. */
		/* ------------------------------------------ */
		if (!str_cmp("changed", arg1))
		{
			char buf[MAX_INPUT_LENGTH];

			save_area_list();

			send_to_char("Saved zones:\n\r", ch);
			sprintf(buf, "None.\n\r");

			for (pArea = area_first; pArea; pArea = pArea->next)
			{
				/* Builder must be assigned this area. */
				if (!IS_BUILDER(ch, pArea))
					continue;

				/* Save changed areas. */
				if (IS_SET(pArea->area_flags, AREA_CHANGED) || IS_SET(pArea->area_flags, AREA_ADDED))
				{
					clean_olc_aflags(pArea);
					save_area(pArea);
					sprintf(buf, "%24s - '%s'\n\r", pArea->name, pArea->file_name);
					send_to_char(buf, ch);
				}
			}

			if (!str_cmp(buf, "None.\n\r"))
				send_to_char(buf, ch);

			return;
		}

		/* Save the area.lst file. */
		/* ----------------------- */
		if (!str_cmp(arg1, "list"))
		{
			save_area_list();
			return;
		}

		/* Save area being edited, if authorized. */
		/* -------------------------------------- */
		if (!str_cmp(arg1, "area"))
		{
			/* Is character currently editing. */
			if (ch->desc->editor == 0)
			{
				send_to_char("You are not editing an area therefore an area vnum is required.\n\r", ch);
				return;
			}

			/* Find the area to save. */
			switch (ch->desc->editor)
			{
				case ED_AREA:
					pArea = (AREA_DATA *)ch->desc->pEdit;
					break;
				case ED_ROOM:
					pArea = ch->in_room->area;
					break;
				case ED_OBJECT:
					pArea = ((OBJ_INDEX_DATA *)ch->desc->pEdit)->area;
					break;
				case ED_MOBILE:
					pArea = ((MOB_INDEX_DATA *)ch->desc->pEdit)->area;
					break;
				default:
					pArea = ch->in_room->area;
					break;
			}

			if (!IS_BUILDER(ch, pArea))
			{
				send_to_char("You are not a builder for this area.\n\r", ch);
				return;
			}

			save_area_list();
			clean_olc_aflags(pArea);
			save_area(pArea);
			send_to_char("Area saved.\n\r", ch);
			return;
		}

		/* Show correct syntax. */
		/* -------------------- */
		do_asave(ch, "");
	}
}